

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtReadHex(word *pTruth,char *pString)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  word wVar9;
  byte bVar10;
  ulong uVar11;
  
  if (*pString == '0') {
    pString = pString + (ulong)(pString[1] == 'x') * 2;
  }
  uVar6 = 0;
  while ((0xf5 < (byte)(pString[uVar6] - 0x3aU) || (0xf9 < (byte)((pString[uVar6] & 0xdfU) + 0xb9)))
        ) {
    uVar6 = uVar6 + 1;
  }
  iVar5 = (int)uVar6;
  if (iVar5 == 1) {
    cVar1 = *pString;
    if (cVar1 != 'F') {
      if ((cVar1 == '5') || (cVar1 == 'A')) {
        wVar9 = 0xaaaaaaaaaaaaaaaa;
        if (cVar1 == '5') {
          wVar9 = 0x5555555555555555;
        }
        iVar4 = 1;
        goto LAB_003f597e;
      }
      if (cVar1 != '0') {
        uVar11 = 1;
        uVar8 = 1;
        goto LAB_003f58bb;
      }
    }
    wVar9 = -(ulong)(cVar1 != '0');
    iVar4 = 0;
  }
  else {
    if (iVar5 == 0) {
      uVar11 = 1;
      uVar8 = uVar6 & 0xffffffff;
    }
    else {
      uVar8 = 0;
      for (uVar3 = iVar5 - 1; uVar3 != 0; uVar3 = uVar3 >> 1) {
        uVar8 = (ulong)((uint)uVar8 + 1);
      }
      uVar11 = (ulong)(uint)(1 << ((char)uVar8 - 4U & 0x1f));
      if ((uint)uVar8 < 5) {
        uVar11 = 1;
      }
    }
LAB_003f58bb:
    for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
      pTruth[uVar11 - 1] = 0;
    }
    uVar3 = (uint)uVar8;
    iVar4 = uVar3 + 2;
    pbVar7 = (byte *)(pString + iVar5);
    bVar10 = 0;
    for (uVar11 = 0; pbVar7 = pbVar7 + -1, uVar6 != uVar11; uVar11 = uVar11 + 1) {
      bVar2 = *pbVar7;
      iVar5 = -0x30;
      if (((9 < (byte)(bVar2 - 0x30)) && (iVar5 = -0x37, 5 < (byte)(bVar2 + 0xbf))) &&
         (iVar5 = -0x57, 5 < (byte)(bVar2 + 0x9f))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x343,"int Abc_TtReadHexDigit(char)");
      }
      pTruth[uVar11 >> 4 & 0xfffffff] =
           pTruth[uVar11 >> 4 & 0xfffffff] | (ulong)(iVar5 + (uint)bVar2) << (bVar10 & 0x3c);
      bVar10 = bVar10 + 4;
    }
    if (3 < uVar3) {
      return iVar4;
    }
    uVar6 = (ulong)((uint)*pTruth & 0xf) * 0x11;
    if (uVar3 != 0) {
      uVar6 = *pTruth;
    }
    iVar5 = 3;
    if (uVar3 != 0) {
      iVar5 = iVar4;
    }
    uVar11 = (uVar6 & 0xff) * 0x101;
    if (iVar5 != 3) {
      uVar11 = uVar6;
    }
    uVar6 = (ulong)(((uint)uVar11 & 0xffff) * 0x10001);
    if (1 < iVar5 - 3U) {
      uVar6 = uVar11;
    }
    wVar9 = (uVar6 & 0xffffffff) * 0x100000001;
  }
LAB_003f597e:
  *pTruth = wVar9;
  return iVar4;
}

Assistant:

static inline int Abc_TtReadHex( word * pTruth, char * pString )
{
    int k, nVars, Digit, nDigits;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // count the number of hex digits
    nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    if ( nDigits == 1 )
    {
        if ( pString[0] == '0' || pString[0] == 'F' )
        {
            pTruth[0] = (pString[0] == '0') ? 0 : ~(word)0;
            return 0;
        }
        if ( pString[0] == '5' || pString[0] == 'A' )
        {
            pTruth[0] = (pString[0] == '5') ? s_Truths6Neg[0] : s_Truths6[0];
            return 1;
        }
    }
    // determine the number of variables
    nVars = 2 + Abc_Base2Log( nDigits );
    // clean storage
    for ( k = Abc_TtWordNum(nVars) - 1; k >= 0; k-- )
        pTruth[k] = 0;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    if ( nVars < 6 )
        pTruth[0] = Abc_Tt6Stretch( pTruth[0], nVars );
    return nVars;
}